

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteVectorReader.h
# Opt level: O0

void __thiscall ByteVectorReader::grow(ByteVectorReader *this,size_t n)

{
  size_type sVar1;
  FILE *__stream;
  char *__buf;
  size_t n_local;
  ByteVectorReader *this_local;
  
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->_bv);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->_bv,sVar1 + n);
  __stream = (FILE *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::front(&this->_bv);
  __buf = (char *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->_bv);
  MemoryReader::setbuf(&this->super_MemoryReader,__stream,__buf);
  return;
}

Assistant:

virtual void grow(size_t n)
    {
        _bv.resize(_bv.size()+n);
        setbuf(&_bv.front(), _bv.size());
    }